

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeImageViewCreateExt
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t hImage,ze_image_handle_t *phImageView)

{
  Logger *this;
  long *plVar1;
  ze_image_handle_t *pp_Var2;
  ze_result_t result;
  ze_result_t zVar3;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  allocator local_69;
  ze_image_handle_t *local_68;
  ze_context_handle_t local_60;
  code *local_58;
  string local_50;
  
  lVar6 = context;
  this = *(Logger **)(context + 0xd50);
  local_68 = phImageView;
  local_60 = hContext;
  std::__cxx11::string::string
            ((string *)&local_50,
             "zeImageViewCreateExt(hContext, hDevice, desc, hImage, phImageView)",&local_69);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar6 + 0x398) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar4 = *(long *)(lVar6 + 0xd38) - *(long *)(lVar6 + 0xd30) >> 3;
    lVar5 = 0;
    local_58 = *(code **)(lVar6 + 0x398);
    do {
      if (lVar4 == lVar5) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeImageViewCreateExtPrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),local_60,hDevice,
                                desc,hImage,local_68), result == ZE_RESULT_SUCCESS)) {
          zVar3 = (*local_58)(local_60,hDevice,desc,hImage,local_68);
          lVar6 = 0;
          goto LAB_00156496;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar1 + 0xa60))(plVar1,local_60,hDevice,desc,hImage,local_68);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001564d8;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar6 * 8);
    result = (**(code **)(*plVar1 + 0xa68))(plVar1,local_60,hDevice,desc,hImage,local_68,zVar3);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_00156496:
    pp_Var2 = local_68;
    lVar5 = context;
    if (lVar4 == lVar6) {
      result = zVar3;
      if (((zVar3 == ZE_RESULT_SUCCESS) && (local_68 != (ze_image_handle_t *)0x0)) &&
         (*(char *)(context + 4) != '\0')) {
        HandleLifetimeValidation::addHandle
                  (*(HandleLifetimeValidation **)(context + 0xd48),*local_68);
        HandleLifetimeValidation::addDependent
                  (*(HandleLifetimeValidation **)(lVar5 + 0xd48),local_60,*pp_Var2);
      }
      break;
    }
  }
LAB_001564d8:
  logAndPropagateResult("zeImageViewCreateExt",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageViewCreateExt(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t hImage,                       ///< [in] handle of image object to create view from
        ze_image_handle_t* phImageView                  ///< [out] pointer to handle of image object created for view
        )
    {
        context.logger->log_trace("zeImageViewCreateExt(hContext, hDevice, desc, hImage, phImageView)");

        auto pfnViewCreateExt = context.zeDdiTable.Image.pfnViewCreateExt;

        if( nullptr == pfnViewCreateExt )
            return logAndPropagateResult("zeImageViewCreateExt", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageViewCreateExtPrologue( hContext, hDevice, desc, hImage, phImageView );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeImageViewCreateExtPrologue( hContext, hDevice, desc, hImage, phImageView );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }

        auto driver_result = pfnViewCreateExt( hContext, hDevice, desc, hImage, phImageView );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageViewCreateExtEpilogue( hContext, hDevice, desc, hImage, phImageView ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageViewCreateExt", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phImageView){
                context.handleLifetime->addHandle( *phImageView );
                context.handleLifetime->addDependent( hContext, *phImageView );

            }
        }
        return logAndPropagateResult("zeImageViewCreateExt", driver_result);
    }